

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::emit_mesh_tasks(CompilerGLSL *this,SPIRBlock *block)

{
  uint32_t uVar1;
  string local_88;
  string local_58;
  string local_38;
  SPIRBlock *local_18;
  SPIRBlock *block_local;
  CompilerGLSL *this_local;
  
  local_18 = block;
  block_local = (SPIRBlock *)this;
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->mesh);
  to_unpacked_expression_abi_cxx11_(&local_38,this,uVar1,true);
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)((local_18->mesh).groups + 1));
  to_unpacked_expression_abi_cxx11_(&local_58,this,uVar1,true);
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)((local_18->mesh).groups + 2));
  to_unpacked_expression_abi_cxx11_(&local_88,this,uVar1,true);
  statement<char_const(&)[18],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
            (this,(char (*) [18])"EmitMeshTasksEXT(",&local_38,(char (*) [3])0x6737c9,&local_58,
             (char (*) [3])0x6737c9,&local_88,(char (*) [3])0x6815da);
  ::std::__cxx11::string::~string((string *)&local_88);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void CompilerGLSL::emit_mesh_tasks(SPIRBlock &block)
{
	statement("EmitMeshTasksEXT(",
	          to_unpacked_expression(block.mesh.groups[0]), ", ",
	          to_unpacked_expression(block.mesh.groups[1]), ", ",
	          to_unpacked_expression(block.mesh.groups[2]), ");");
}